

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddReord.c
# Opt level: O2

int cuddZddSifting(DdManager *table,int lower,int upper)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  int iVar3;
  int *__ptr;
  void *__base;
  ulong uVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  ulong uVar7;
  long lVar8;
  DdNode *moves;
  
  uVar1 = table->sizeZ;
  __size = (long)(int)uVar1 * 4;
  __ptr = (int *)malloc(__size);
  zdd_entry = __ptr;
  if (__ptr == (int *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    __base = (void *)0x0;
  }
  else {
    __base = malloc(__size);
    if (__base == (void *)0x0) {
      table->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      uVar4 = 0;
      uVar7 = 0;
      if (0 < (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
      for (; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        __ptr[uVar4] = table->subtableZ[table->permZ[uVar4]].keys;
        *(int *)((long)__base + uVar4 * 4) = (int)uVar4;
      }
      qsort(__base,(long)(int)uVar1,4,cuddZddUniqueCompare);
      lVar8 = 0;
LAB_00679763:
      uVar2 = table->siftMaxVar;
      if ((int)uVar1 < table->siftMaxVar) {
        uVar2 = uVar1;
      }
      if (((int)uVar2 <= lVar8) || (table->siftMaxSwap <= zddTotalNumberSwapping)) {
        free(__base);
        if (zdd_entry == (int *)0x0) {
          return 1;
        }
        free(zdd_entry);
        zdd_entry = (int *)0x0;
        return 1;
      }
      iVar3 = table->permZ[*(int *)((long)__base + lVar8 * 4)];
      if (upper < iVar3 || iVar3 < lower) {
LAB_006797a9:
        lVar8 = lVar8 + 1;
        goto LAB_00679763;
      }
      uVar2 = table->keysZ;
      if (iVar3 == lower) {
        pDVar5 = (DdNode *)cuddZddSiftingDown(table,lower,upper,uVar2);
        if (pDVar5 == (DdNode *)0x0) goto LAB_00679948;
        iVar3 = cuddZddSiftingBackward(table,(Move *)pDVar5,uVar2);
        moves = (DdNode *)0x0;
LAB_0067989a:
        if (iVar3 == 0) goto LAB_00679971;
        while (pDVar5 != (DdNode *)0x0) {
          pDVar6 = (pDVar5->type).kids.T;
          pDVar5->ref = 0;
          pDVar5->next = table->nextFree;
          table->nextFree = pDVar5;
          pDVar5 = pDVar6;
        }
        while (moves != (DdNode *)0x0) {
          pDVar5 = (moves->type).kids.T;
          moves->ref = 0;
          moves->next = table->nextFree;
          table->nextFree = moves;
          moves = pDVar5;
        }
        goto LAB_006797a9;
      }
      if (upper == iVar3) {
        moves = (DdNode *)cuddZddSiftingUp(table,upper,lower,uVar2);
        if (moves != (DdNode *)0x0) {
          iVar3 = cuddZddSiftingBackward(table,(Move *)moves,uVar2);
          pDVar5 = (DdNode *)0x0;
          goto LAB_0067989a;
        }
LAB_00679948:
        moves = (DdNode *)0x0;
      }
      else {
        if (upper - iVar3 < iVar3 - lower) {
          pDVar5 = (DdNode *)cuddZddSiftingDown(table,iVar3,upper,uVar2);
          if (pDVar5 == (DdNode *)0x0) goto LAB_00679948;
          pDVar6 = (DdNode *)cuddZddSiftingUp(table,pDVar5->ref,lower,uVar2);
          moves = pDVar6;
          if (pDVar6 != (DdNode *)0x0) {
LAB_0067988c:
            iVar3 = cuddZddSiftingBackward(table,(Move *)pDVar6,uVar2);
            goto LAB_0067989a;
          }
          moves = (DdNode *)0x0;
          goto LAB_00679971;
        }
        moves = (DdNode *)cuddZddSiftingUp(table,iVar3,lower,uVar2);
        if (moves == (DdNode *)0x0) goto LAB_00679948;
        pDVar6 = (DdNode *)cuddZddSiftingDown(table,moves->index,upper,uVar2);
        pDVar5 = pDVar6;
        if (pDVar6 != (DdNode *)0x0) goto LAB_0067988c;
      }
      pDVar5 = (DdNode *)0x0;
LAB_00679971:
      while (pDVar5 != (DdNode *)0x0) {
        pDVar6 = (pDVar5->type).kids.T;
        pDVar5->ref = 0;
        pDVar5->next = table->nextFree;
        table->nextFree = pDVar5;
        pDVar5 = pDVar6;
      }
      while (moves != (DdNode *)0x0) {
        pDVar5 = (moves->type).kids.T;
        moves->ref = 0;
        moves->next = table->nextFree;
        table->nextFree = moves;
        moves = pDVar5;
      }
      __ptr = zdd_entry;
      if (zdd_entry == (int *)0x0) goto LAB_006799b7;
    }
    free(__ptr);
    zdd_entry = (int *)0x0;
  }
LAB_006799b7:
  free(__base);
  return 0;
}

Assistant:

int
cuddZddSifting(
  DdManager * table,
  int  lower,
  int  upper)
{
    int i;
    int *var;
    int size;
    int x;
    int result;
#ifdef DD_STATS
    int previousSize;
#endif

    size = table->sizeZ;

    /* Find order in which to sift variables. */
    var = NULL;
    zdd_entry = ABC_ALLOC(int, size);
    if (zdd_entry == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }
    var = ABC_ALLOC(int, size);
    if (var == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        goto cuddZddSiftingOutOfMem;
    }

    for (i = 0; i < size; i++) {
        x = table->permZ[i];
        zdd_entry[i] = table->subtableZ[x].keys;
        var[i] = i;
    }

    qsort((void *)var, size, sizeof(int), (DD_QSFP)cuddZddUniqueCompare);

    /* Now sift. */
    for (i = 0; i < ddMin(table->siftMaxVar, size); i++) {
        if (zddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        x = table->permZ[var[i]];
        if (x < lower || x > upper) continue;
#ifdef DD_STATS
        previousSize = table->keysZ;
#endif
        result = cuddZddSiftingAux(table, x, lower, upper);
        if (!result)
            goto cuddZddSiftingOutOfMem;
#ifdef DD_STATS
        if (table->keysZ < (unsigned) previousSize) {
            (void) fprintf(table->out,"-");
        } else if (table->keysZ > (unsigned) previousSize) {
            (void) fprintf(table->out,"+");     /* should never happen */
            (void) fprintf(table->out,"\nSize increased from %d to %d while sifting variable %d\n", previousSize, table->keysZ , var[i]);
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
    }

    ABC_FREE(var);
    ABC_FREE(zdd_entry);

    return(1);

cuddZddSiftingOutOfMem:

    if (zdd_entry != NULL) ABC_FREE(zdd_entry);
    if (var != NULL) ABC_FREE(var);

    return(0);

}